

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O1

Sfm_Ntk_t * Abc_NtkExtractMfs(Abc_Ntk_t *pNtk,int nFirstFixed)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  Vec_Ptr_t *__ptr;
  Vec_Wec_t *vFanins;
  Vec_Int_t *pVVar4;
  Vec_Str_t *vFixed;
  char *__s;
  Vec_Wrd_t *vTruths;
  word *__s_00;
  word wVar5;
  long lVar6;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  Sfm_Ntk_t *pSVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint nPis;
  size_t __n;
  
  if (nFirstFixed == 0) {
    __ptr = Abc_NtkAssignIDs(pNtk);
  }
  else {
    __ptr = Abc_NtkAssignIDs2(pNtk);
  }
  __n = (long)pNtk->vCos->nSize + (long)__ptr->nSize + (long)pNtk->vCis->nSize;
  vFanins = (Vec_Wec_t *)malloc(0x10);
  iVar1 = (int)__n;
  iVar10 = 8;
  if (6 < iVar1 - 1U) {
    iVar10 = iVar1;
  }
  vFanins->nSize = 0;
  vFanins->nCap = iVar10;
  if (iVar10 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar10,0x10);
  }
  vFanins->pArray = pVVar4;
  vFanins->nSize = iVar1;
  vFixed = (Vec_Str_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar10 = iVar1;
  }
  vFixed->nSize = 0;
  vFixed->nCap = iVar10;
  if (iVar10 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar10);
  }
  vFixed->pArray = __s;
  vFixed->nSize = iVar1;
  memset(__s,0,__n);
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  vTruths->nSize = 0;
  vTruths->nCap = iVar10;
  if (iVar10 == 0) {
    __s_00 = (word *)0x0;
  }
  else {
    __s_00 = (word *)malloc((long)iVar10 << 3);
  }
  vTruths->pArray = __s_00;
  vTruths->nSize = iVar1;
  memset(__s_00,0,__n * 8);
  if (0 < __ptr->nSize) {
    lVar12 = 0;
    do {
      plVar3 = (long *)__ptr->pArray[lVar12];
      wVar5 = Abc_SopToTruth((char *)plVar3[7],*(int *)((long)plVar3 + 0x1c));
      iVar1 = (int)plVar3[8];
      if (((long)iVar1 < 0) || (vTruths->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
      }
      vTruths->pArray[iVar1] = wVar5;
      if (1 < wVar5 + 1) {
        lVar6 = (long)(int)plVar3[8];
        if ((lVar6 < 0) || (vFanins->nSize <= (int)plVar3[8])) goto LAB_002d3343;
        pVVar4 = vFanins->pArray + lVar6;
        iVar1 = *(int *)((long)plVar3 + 0x1c);
        if (vFanins->pArray[lVar6].nCap < iVar1) {
          if (pVVar4->pArray == (int *)0x0) {
            piVar7 = (int *)malloc((long)iVar1 << 2);
          }
          else {
            piVar7 = (int *)realloc(pVVar4->pArray,(long)iVar1 << 2);
          }
          pVVar4->pArray = piVar7;
          if (piVar7 == (int *)0x0) goto LAB_002d33a0;
          pVVar4->nCap = iVar1;
        }
        if (0 < *(int *)((long)plVar3 + 0x1c)) {
          lVar6 = 0;
          do {
            Vec_IntPush(pVVar4,*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                                 (long)*(int *)(plVar3[4] + lVar6 * 4) * 8) + 0x40))
            ;
            lVar6 = lVar6 + 1;
          } while (lVar6 < *(int *)((long)plVar3 + 0x1c));
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < __ptr->nSize);
  }
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar12];
      lVar6 = (long)(int)plVar3[8];
      if ((lVar6 < 0) || (vFanins->nSize <= (int)plVar3[8])) {
LAB_002d3343:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar4 = vFanins->pArray + lVar6;
      iVar1 = *(int *)((long)plVar3 + 0x1c);
      if (vFanins->pArray[lVar6].nCap < iVar1) {
        if (pVVar4->pArray == (int *)0x0) {
          piVar7 = (int *)malloc((long)iVar1 << 2);
        }
        else {
          piVar7 = (int *)realloc(pVVar4->pArray,(long)iVar1 << 2);
        }
        pVVar4->pArray = piVar7;
        if (piVar7 == (int *)0x0) {
LAB_002d33a0:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar4->nCap = iVar1;
      }
      if (0 < *(int *)((long)plVar3 + 0x1c)) {
        lVar6 = 0;
        do {
          Vec_IntPush(pVVar4,*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                               (long)*(int *)(plVar3[4] + lVar6 * 4) * 8) + 0x40));
          lVar6 = lVar6 + 1;
        } while (lVar6 < *(int *)((long)plVar3 + 0x1c));
      }
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar12 < pVVar8->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  uVar2 = pNtk->vCis->nSize;
  uVar11 = (ulong)uVar2;
  nPis = uVar2;
  if (0 < nFirstFixed) {
    do {
      if (((int)uVar2 < 0) || (vFixed->nSize <= (int)uVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      vFixed->pArray[uVar11] = '\x01';
      uVar11 = uVar11 + 1;
      nPis = pNtk->vCis->nSize;
    } while ((int)uVar11 < (int)(nPis + nFirstFixed));
  }
  if ((-1 < nFirstFixed) && (nFirstFixed < pNtk->nObjCounts[7])) {
    pSVar9 = Sfm_NtkConstruct(vFanins,nPis,pNtk->vCos->nSize,vFixed,(Vec_Str_t *)0x0,vTruths);
    return pSVar9;
  }
  __assert_fail("nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                ,0x82,"Sfm_Ntk_t *Abc_NtkExtractMfs(Abc_Ntk_t *, int)");
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs( Abc_Ntk_t * pNtk, int nFirstFixed )
{
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs;
    vNodes  = nFirstFixed ? Abc_NtkAssignIDs2(pNtk) : Abc_NtkAssignIDs(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
        Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
        if ( uTruth == 0 || ~uTruth == 0 )
            continue;
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    for ( i = Abc_NtkCiNum(pNtk); i < Abc_NtkCiNum(pNtk) + nFirstFixed; i++ )
        Vec_StrWriteEntry( vFixed, i, (char)1 );
    // update fixed
    assert( nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk) );
//    for ( i = Abc_NtkCiNum(pNtk); i + Abc_NtkCoNum(pNtk) < Abc_NtkObjNum(pNtk); i++ )
//        if ( rand() % 10 == 0 )
//            Vec_StrWriteEntry( vFixed, i, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths );
}